

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterReverse(Fts5Index *p,Fts5SegIter *pIter)

{
  Fts5StructureSegment *pFVar1;
  bool bVar2;
  byte bVar3;
  u16 uVar4;
  int iVar5;
  Fts5Data *pFVar6;
  long lVar7;
  int iVar8;
  int iOff;
  Fts5Data *tmp;
  int bTermless;
  int iRowid;
  Fts5Data *pNew;
  i64 iAbs;
  Fts5StructureSegment *pSeg;
  int pgno;
  int iEnd;
  int iPoslist;
  Fts5Data *pLeaf;
  int iSegid;
  int pgnoLast;
  Fts5Data *pLast;
  Fts5DlidxIter *pDlidx;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  _iSegid = (Fts5Data *)0x0;
  pLeaf._4_4_ = 0;
  if (pIter->pDlidx == (Fts5DlidxIter *)0x0) {
    if (pIter->iTermLeafPgno == pIter->iLeafPgno) {
      pgno = pIter->iTermLeafOffset;
    }
    else {
      pgno = 4;
    }
    iVar5 = pgno + 9;
    do {
      iVar8 = pgno + 1;
      lVar7 = (long)pgno;
      pgno = iVar8;
    } while ((pIter->pLeaf->p[lVar7] & 0x80) != 0 && iVar8 < iVar5);
    pIter->iLeafOffset = iVar8;
    if (pIter->pLeaf->szLeaf <= pIter->iEndofDoclist) {
      pFVar1 = pIter->pSeg;
      pSeg._4_4_ = pIter->iLeafPgno;
      do {
        do {
          pSeg._4_4_ = pSeg._4_4_ + 1;
          bVar2 = false;
          if (p->rc == 0) {
            bVar2 = pSeg._4_4_ <= pFVar1->pgnoLast;
          }
          if (!bVar2) goto LAB_00276818;
          pFVar6 = fts5DataRead(p,((long)pFVar1->iSegid << 0x25) + (long)pSeg._4_4_);
        } while (pFVar6 == (Fts5Data *)0x0);
        uVar4 = fts5GetU16(pFVar6->p);
        iVar8 = pFVar6->szLeaf;
        iVar5 = pFVar6->nn;
        _bTermless = pFVar6;
        if (uVar4 != 0) {
          _bTermless = _iSegid;
          pLeaf._4_4_ = pSeg._4_4_;
          _iSegid = pFVar6;
        }
        fts5DataRelease(_bTermless);
      } while (iVar5 <= iVar8);
    }
  }
  else {
    iVar5 = pIter->pSeg->iSegid;
    pLeaf._4_4_ = fts5DlidxIterPgno(pIter->pDlidx);
    _iSegid = fts5DataRead(p,((long)iVar5 << 0x25) + (long)pLeaf._4_4_);
  }
LAB_00276818:
  if (_iSegid != (Fts5Data *)0x0) {
    fts5DataRelease(pIter->pLeaf);
    pIter->pLeaf = _iSegid;
    pIter->iLeafPgno = pLeaf._4_4_;
    uVar4 = fts5GetU16(_iSegid->p);
    bVar3 = sqlite3Fts5GetVarint(_iSegid->p + (int)(uint)uVar4,(u64 *)&pIter->iRowid);
    pIter->iLeafOffset = (uint)bVar3 + (uint)uVar4;
    if (_iSegid->szLeaf < _iSegid->nn) {
      iVar5 = fts5LeafFirstTermOff(_iSegid);
      pIter->iEndofDoclist = iVar5;
    }
    else {
      pIter->iEndofDoclist = _iSegid->nn + 1;
    }
  }
  fts5SegIterReverseInitPage(p,pIter);
  return;
}

Assistant:

static void fts5SegIterReverse(Fts5Index *p, Fts5SegIter *pIter){
  Fts5DlidxIter *pDlidx = pIter->pDlidx;
  Fts5Data *pLast = 0;
  int pgnoLast = 0;

  if( pDlidx ){
    int iSegid = pIter->pSeg->iSegid;
    pgnoLast = fts5DlidxIterPgno(pDlidx);
    pLast = fts5DataRead(p, FTS5_SEGMENT_ROWID(iSegid, pgnoLast));
  }else{
    Fts5Data *pLeaf = pIter->pLeaf;         /* Current leaf data */

    /* Currently, Fts5SegIter.iLeafOffset points to the first byte of
    ** position-list content for the current rowid. Back it up so that it
    ** points to the start of the position-list size field. */
    int iPoslist;
    if( pIter->iTermLeafPgno==pIter->iLeafPgno ){
      iPoslist = pIter->iTermLeafOffset;
    }else{
      iPoslist = 4;
    }
    fts5IndexSkipVarint(pLeaf->p, iPoslist);
    pIter->iLeafOffset = iPoslist;

    /* If this condition is true then the largest rowid for the current
    ** term may not be stored on the current page. So search forward to
    ** see where said rowid really is.  */
    if( pIter->iEndofDoclist>=pLeaf->szLeaf ){
      int pgno;
      Fts5StructureSegment *pSeg = pIter->pSeg;

      /* The last rowid in the doclist may not be on the current page. Search
      ** forward to find the page containing the last rowid.  */
      for(pgno=pIter->iLeafPgno+1; !p->rc && pgno<=pSeg->pgnoLast; pgno++){
        i64 iAbs = FTS5_SEGMENT_ROWID(pSeg->iSegid, pgno);
        Fts5Data *pNew = fts5DataRead(p, iAbs);
        if( pNew ){
          int iRowid, bTermless;
          iRowid = fts5LeafFirstRowidOff(pNew);
          bTermless = fts5LeafIsTermless(pNew);
          if( iRowid ){
            SWAPVAL(Fts5Data*, pNew, pLast);
            pgnoLast = pgno;
          }
          fts5DataRelease(pNew);
          if( bTermless==0 ) break;
        }
      }
    }
  }

  /* If pLast is NULL at this point, then the last rowid for this doclist
  ** lies on the page currently indicated by the iterator. In this case 
  ** pIter->iLeafOffset is already set to point to the position-list size
  ** field associated with the first relevant rowid on the page.
  **
  ** Or, if pLast is non-NULL, then it is the page that contains the last
  ** rowid. In this case configure the iterator so that it points to the
  ** first rowid on this page.
  */
  if( pLast ){
    int iOff;
    fts5DataRelease(pIter->pLeaf);
    pIter->pLeaf = pLast;
    pIter->iLeafPgno = pgnoLast;
    iOff = fts5LeafFirstRowidOff(pLast);
    iOff += fts5GetVarint(&pLast->p[iOff], (u64*)&pIter->iRowid);
    pIter->iLeafOffset = iOff;

    if( fts5LeafIsTermless(pLast) ){
      pIter->iEndofDoclist = pLast->nn+1;
    }else{
      pIter->iEndofDoclist = fts5LeafFirstTermOff(pLast);
    }

  }

  fts5SegIterReverseInitPage(p, pIter);
}